

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::Functional::anon_unknown_0::ScissorClearCase::render
          (ScissorClearCase *this,GLuint program,IVec4 *param_2)

{
  glUniform4fvFunc p_Var1;
  int iVar2;
  GLint GVar3;
  undefined4 extraout_var;
  uint uVar4;
  GLfloat local_58 [6];
  Vec3 local_40;
  Vec3 local_30;
  Functions *gl;
  
  iVar2 = (*((this->super_ScissorCase).m_renderCtx)->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  local_58[0] = 1.0;
  local_58[1] = 1.0;
  local_58[2] = 1.0;
  local_58[3] = 1.0;
  (*gl->clearColor)(0.6,0.1,0.1,1.0);
  (*gl->clearDepthf)(0.0);
  uVar4 = this->m_clearMode;
  if ((uVar4 >> 8 & 1) != 0) {
    (*gl->enable)(0xb71);
    (*gl->depthFunc)(0x204);
    uVar4 = this->m_clearMode;
  }
  if ((uVar4 >> 10 & 1) != 0) {
    (*gl->clearStencil)(0x7b);
    (*gl->enable)(0xb90);
    (*gl->stencilFunc)(0x202,0x7b,0xffffffff);
    uVar4 = this->m_clearMode;
  }
  if ((uVar4 >> 0xe & 1) != 0) {
    (*gl->clearColor)(0.1,0.6,0.1,1.0);
    uVar4 = this->m_clearMode;
  }
  (*gl->clear)(uVar4);
  (*gl->disable)(0xc11);
  p_Var1 = gl->uniform4fv;
  GVar3 = (*gl->getUniformLocation)(program,"u_color");
  (*p_Var1)(GVar3,1,local_58);
  if ((this->m_clearMode & 0x4000) == 0) {
    local_30.m_data[0] = -1.0;
    local_30.m_data[1] = -1.0;
    local_30.m_data[2] = 0.5;
    local_40.m_data[0] = 1.0;
    local_40.m_data[1] = 1.0;
    local_40.m_data[2] = 0.5;
    drawQuad(gl,program,&local_30,&local_40);
  }
  (*gl->disable)(0xb71);
  (*gl->disable)(0xb90);
  return;
}

Assistant:

void ScissorClearCase::render (GLuint program, const IVec4&) const
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	const Vec4				white	(1.0f, 1.0f, 1.0f, 1.0);

	gl.clearColor(0.6f, 0.1f, 0.1f, 1.0);
	gl.clearDepthf(0.0f);

	if (m_clearMode & GL_DEPTH_BUFFER_BIT)
	{
		gl.enable(GL_DEPTH_TEST);
		gl.depthFunc(GL_GREATER);
	}

	if (m_clearMode & GL_STENCIL_BUFFER_BIT)
	{
		gl.clearStencil(123);
		gl.enable(GL_STENCIL_TEST);
		gl.stencilFunc(GL_EQUAL, 123, ~0u);
	}

	if (m_clearMode & GL_COLOR_BUFFER_BIT)
		gl.clearColor(0.1f, 0.6f, 0.1f, 1.0);

	gl.clear(m_clearMode);
	gl.disable(GL_SCISSOR_TEST);

	gl.uniform4fv(gl.getUniformLocation(program, "u_color"), 1, white.getPtr());

	if (!(m_clearMode & GL_COLOR_BUFFER_BIT))
		drawQuad(gl, program, Vec3(-1.0f, -1.0f, 0.5f), Vec3(1.0f, 1.0f, 0.5f));

	gl.disable(GL_DEPTH_TEST);
	gl.disable(GL_STENCIL_TEST);
}